

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DHMap.hpp
# Opt level: O0

bool __thiscall
Lib::
DHMap<std::pair<unsigned_int,_unsigned_int>,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>
::IteratorBase::hasNext(IteratorBase *this)

{
  IteratorBase *this_local;
  
  while( true ) {
    if (this->_next == this->_last) {
      return false;
    }
    if (((uint)(this->_next->field_0)._infoData >> 2 == this->_timestamp) &&
       (((this->_next->field_0)._infoData & 1U) == 0)) break;
    this->_next = this->_next + 1;
  }
  return true;
}

Assistant:

bool hasNext()
    {
      while (_next != _last) {
	if (_next->_info.timestamp==_timestamp && !_next->_info.deleted) {
	  return true;
	}
	_next++;
      }
      return false;
    }